

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch.2.13.10.hpp
# Opt level: O3

bool __thiscall
Catch::Matchers::StdString::ContainsMatcher::match(ContainsMatcher *this,string *source)

{
  long lVar1;
  string local_30;
  
  CasedString::adjustString(&local_30,&(this->super_StringMatcherBase).m_comparator,source);
  lVar1 = std::__cxx11::string::find
                    ((char *)&local_30,
                     (ulong)(this->super_StringMatcherBase).m_comparator.m_str._M_dataplus._M_p,0);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_30._M_dataplus._M_p != &local_30.field_2) {
    operator_delete(local_30._M_dataplus._M_p,local_30.field_2._M_allocated_capacity + 1);
  }
  return lVar1 != -1;
}

Assistant:

bool ContainsMatcher::match( std::string const& source ) const {
            return contains( m_comparator.adjustString( source ), m_comparator.m_str );
        }